

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

void __thiscall
chaiscript::detail::Dispatch_Engine::dump_type(Dispatch_Engine *this,Type_Info *type)

{
  ostream *poVar1;
  char *pcVar2;
  string local_40;
  
  pcVar2 = "const ";
  if ((type->m_flags & 1) == 0) {
    pcVar2 = "";
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
  get_type_name_abi_cxx11_(&local_40,this,type);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void dump_type(const Type_Info &type) const
        {
          std::cout << (type.is_const()?"const ":"") << get_type_name(type);
        }